

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ClockingItemSyntax::setChild
          (ClockingItemSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004b3fb8 + *(int *)(&DAT_004b3fb8 + index * 4)))();
  return;
}

Assistant:

void ClockingItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: direction = child.node() ? &child.node()->as<ClockingDirectionSyntax>() : nullptr; return;
        case 2: decls = child.node()->as<SeparatedSyntaxList<AttributeSpecSyntax>>(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}